

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O1

void cfd::TransactionContextUtil::AddSign<cfd::ConfidentialTransactionContext>
               (ConfidentialTransactionContext *transaction,OutPoint *outpoint,
               vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_params,
               bool insert_witness,bool clear_stack)

{
  pointer pSVar1;
  char cVar2;
  bool bVar3;
  undefined4 uVar4;
  uint uVar5;
  CfdException *pCVar6;
  pointer pSVar7;
  pointer pSVar8;
  bool bVar9;
  ScriptElement *element;
  ScriptBuilder builder;
  Txid txid;
  ScriptOperator op_code;
  Script script;
  Script local_240;
  undefined **local_208;
  void *local_200;
  undefined1 local_1e8 [16];
  char *local_1d8 [2];
  _func_int *local_1c8 [2];
  Script local_1b8 [5];
  undefined **local_88;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_80;
  Script local_68;
  
  if (transaction == (ConfidentialTransactionContext *)0x0) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Empty transaction.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1e8);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if ((sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (sign_params->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_1e8._0_8_ = "cfd_transaction_internal.cpp";
    local_1e8._8_4_ = kOpSuccess252;
    local_1d8[0] = "AddSign";
    core::logger::log<>((CfdSourceLocation *)local_1e8,kCfdLogLevelWarning,
                        "Failed to AddSign. Empty sign_params.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Empty sign_params.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1e8);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cVar2 = cfd::core::OutPoint::IsValid();
  if (cVar2 == '\0') {
    local_1e8._0_8_ = "cfd_transaction_internal.cpp";
    local_1e8._8_4_ = 0x101;
    local_1d8[0] = "AddSign";
    core::logger::log<>((CfdSourceLocation *)local_1e8,kCfdLogLevelWarning,
                        "Failed to AddSign. Invalid outpoint.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"Invalid outpoint.","");
    core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_1e8);
    __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (insert_witness) {
    bVar9 = false;
  }
  else {
    pSVar7 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar7 == pSVar1) {
      bVar9 = false;
    }
    else {
      bVar9 = false;
      do {
        bVar3 = SignParameter::IsOpCode(pSVar7);
        if (bVar3) {
          SignParameter::GetOpCode((ScriptOperator *)local_1e8,pSVar7);
          cVar2 = cfd::core::ScriptOperator::IsPushOperator();
          if (cVar2 != '\0') {
            bVar9 = true;
          }
          local_1e8._0_8_ = &PTR__ScriptOperator_002b2f30;
          if ((_func_int **)local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0]);
          }
        }
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar1);
    }
  }
  cfd::core::OutPoint::GetTxid();
  uVar4 = cfd::core::OutPoint::GetVout();
  uVar5 = (**(code **)(*(long *)transaction + 0x10))(transaction,&local_208,uVar4);
  if (insert_witness) {
    if (clear_stack) {
      cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll((uint)transaction);
    }
    pSVar7 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar7 != pSVar1) {
      do {
        SignParameter::ConvertToSignature((ByteData *)local_1e8,pSVar7);
        cfd::core::ConfidentialTransaction::AddScriptWitnessStack
                  ((uint)&local_88,(ByteData *)transaction);
        local_88 = &PTR__ScriptWitness_002b2f60;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_80);
        if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1e8._0_8_);
        }
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar1);
    }
  }
  else {
    cfd::core::Script::Script(&local_68);
    if (!clear_stack) {
      cfd::core::ConfidentialTransaction::GetTxIn((uint)local_1e8);
      cfd::core::Script::Script(&local_240,local_1b8);
      cfd::core::Script::operator=(&local_68,&local_240);
      core::Script::~Script(&local_240);
      core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_1e8);
    }
    local_240._vptr_Script = (_func_int **)&PTR__ScriptBuilder_002b2fc0;
    local_240.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_240.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_240.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::Script::GetElementList();
    if ((pointer)local_1e8._0_8_ != (pointer)CONCAT44(local_1e8._12_4_,local_1e8._8_4_)) {
      pSVar8 = (pointer)local_1e8._0_8_;
      do {
        cfd::core::ScriptBuilder::AppendElement((ScriptElement *)&local_240);
        pSVar8 = pSVar8 + 0x60;
      } while (pSVar8 != (pointer)CONCAT44(local_1e8._12_4_,local_1e8._8_4_));
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_1e8);
    pSVar7 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (sign_params->
             super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar7 != pSVar1) {
      do {
        if ((bVar9) && (bVar3 = SignParameter::IsOpCode(pSVar7), bVar3)) {
          SignParameter::GetOpCode((ScriptOperator *)local_1e8,pSVar7);
          cfd::core::ScriptBuilder::AppendOperator((ScriptOperator *)&local_240);
          local_1e8._0_8_ = &PTR__ScriptOperator_002b2f30;
          pSVar8 = (pointer)local_1d8[0];
          if ((_func_int **)local_1d8[0] != local_1c8) {
LAB_001cd808:
            operator_delete(pSVar8);
          }
        }
        else {
          SignParameter::ConvertToSignature((ByteData *)local_1e8,pSVar7);
          cfd::core::ScriptBuilder::AppendData((ByteData *)&local_240);
          pSVar8 = (pointer)local_1e8._0_8_;
          if ((pointer)local_1e8._0_8_ != (pointer)0x0) goto LAB_001cd808;
        }
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar1);
    }
    cfd::core::ScriptBuilder::Build();
    cfd::core::ConfidentialTransaction::SetUnlockingScript((uint)transaction,(Script *)(ulong)uVar5)
    ;
    core::Script::~Script((Script *)local_1e8);
    local_240._vptr_Script = (_func_int **)&PTR__ScriptBuilder_002b2fc0;
    if (local_240.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_240.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::Script::~Script(&local_68);
  }
  local_208 = &PTR__Txid_002b2f00;
  if (local_200 != (void *)0x0) {
    operator_delete(local_200);
  }
  return;
}

Assistant:

void TransactionContextUtil::AddSign(
    Tx* transaction, const OutPoint& outpoint,
    const std::vector<SignParameter>& sign_params, bool insert_witness,
    bool clear_stack) {
  if (transaction == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty transaction.");
  }
  if (sign_params.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Empty sign_params.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty sign_params.");
  }
  if (!outpoint.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to AddSign. Invalid outpoint.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid outpoint.");
  }

  bool has_op_code = false;
  if (!insert_witness) {
    for (const SignParameter& sign_param : sign_params) {
      if (sign_param.IsOpCode()) {
        ScriptOperator op_code = sign_param.GetOpCode();
        if (op_code.IsPushOperator()) {
          has_op_code = true;
        }
      }
    }
  }
  Txid txid = outpoint.GetTxid();
  uint32_t vout = outpoint.GetVout();
  uint32_t txin_index = transaction->GetTxInIndex(txid, vout);

  if (insert_witness) {
    if (clear_stack) {
      transaction->RemoveScriptWitnessStackAll(txin_index);
    }
    for (const SignParameter& sign_param : sign_params) {
      transaction->AddScriptWitnessStack(
          txin_index, sign_param.ConvertToSignature());
    }
  } else {
    Script script;
    if (!clear_stack) {
      script = transaction->GetTxIn(txin_index).GetUnlockingScript();
    }
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const SignParameter& sign_param : sign_params) {
      if (has_op_code && sign_param.IsOpCode()) {
        // Checking push-operator is performed at the time of registration.
        builder.AppendOperator(sign_param.GetOpCode());
      } else {
        builder.AppendData(sign_param.ConvertToSignature());
      }
    }
    transaction->SetUnlockingScript(txin_index, builder.Build());
  }
}